

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tt2ps.cpp
# Opt level: O2

void __thiscall ConstructCffPath::Line(ConstructCffPath *this,json *cubicContour,Point p1)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Point p2;
  Point p1_local;
  Point p3;
  
  dVar8 = p1.y;
  dVar6 = p1.x;
  p1_local.x = dVar6;
  p1_local.y = dVar8;
  sVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)this);
  if (1 < sVar3) {
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)this,sVar3 - 2);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar4,"on");
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<bool,_bool,_0>(pvVar4);
    if (bVar1) {
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,sVar3 - 1);
      Point::Point(&p2,pvVar4);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,sVar3 - 2);
      Point::Point(&p3,pvVar4);
      dVar7 = p3.y - dVar8;
      dVar9 = dVar6 - p3.x;
      iVar2 = (int)(p2.x * dVar7 + p2.y * dVar9 + p3.x * dVar8 + -dVar6 * p3.y);
      iVar5 = -iVar2;
      if (0 < iVar2) {
        iVar5 = iVar2;
      }
      if ((double)iVar5 / SQRT(dVar7 * dVar7 + dVar9 * dVar9) < 1.0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this,sVar3 - 1);
      }
    }
  }
  Point::ToJson_abi_cxx11_(&p2,SUB81(&p1_local,0));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&p2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&p2);
  return;
}

Assistant:

void Line(json &cubicContour, Point p1)
{
	size_t length = cubicContour.size();
	if (length >= 2 && cubicContour[length - 2]["on"])
	{
		// 2 lines, merge if the are collinear.
		Point p2 = cubicContour[length - 1];
		Point p3 = cubicContour[length - 2];
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			cubicContour.erase(length - 1);
	}
	cubicContour.push_back(p1.ToJson(true));
}